

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::EscapeKdoc_abi_cxx11_
          (string *__return_storage_ptr__,java *this,string_view input)

{
  char cVar1;
  const_iterator pvVar2;
  char cVar3;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string_view *__range3;
  char prev;
  undefined1 local_20 [8];
  string_view input_local;
  string *result;
  
  input_local._M_len = input._M_len;
  local_20 = (undefined1  [8])this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __range3._3_1_ = 'a';
  __end3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  for (; __end3 != pvVar2; __end3 = __end3 + 1) {
    cVar1 = *__end3;
    cVar3 = (char)__return_storage_ptr__;
    if (cVar1 == '*') {
      if (__range3._3_1_ == '/') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back(cVar3);
      }
    }
    else if (cVar1 == '/') {
      if (__range3._3_1_ == '*') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back(cVar3);
      }
    }
    else {
      std::__cxx11::string::push_back(cVar3);
    }
    __range3._3_1_ = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string EscapeKdoc(absl::string_view input) {
  std::string result;
  result.reserve(input.size() * 2);

  char prev = 'a';

  for (char c : input) {
    switch (c) {
      case '*':
        // Avoid "/*".
        if (prev == '/') {
          result.append("&#42;");
        } else {
          result.push_back(c);
        }
        break;
      case '/':
        // Avoid "*/".
        if (prev == '*') {
          result.append("&#47;");
        } else {
          result.push_back(c);
        }
        break;
      default:
        result.push_back(c);
        break;
    }

    prev = c;
  }

  return result;
}